

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

Optional<Corrade::Utility::Json> Corrade::Utility::Json::fromFile(StringView filename)

{
  undefined1 auVar1 [16];
  StringView value;
  StringView filename_00;
  bool bVar2;
  Debug *this;
  String *string_00;
  size_t in_RDX;
  undefined8 extraout_RDX;
  ulong in_R9;
  StringView filename_01;
  Optional<Corrade::Utility::Json> OVar3;
  BasicStringView<const_char> local_d8;
  size_t local_c8;
  size_t sStack_c0;
  undefined4 local_b0;
  bool local_a8;
  undefined7 uStack_a7;
  Flags local_91;
  Error local_90;
  char *local_58;
  undefined1 local_40 [8];
  Optional<Corrade::Containers::String> string;
  StringView filename_local;
  
  local_58 = (char *)filename._sizePlusFlags;
  filename_01._data = (anon_union_8_1_49ece5b0_for_Optional<Corrade::Utility::Json>_1)filename._data
  ;
  filename_00._sizePlusFlags = in_RDX;
  filename_00._data = local_58;
  string._24_8_ = local_58;
  Path::readString((Optional<Corrade::Containers::String> *)local_40,filename_00);
  bVar2 = Containers::Optional::operator_cast_to_bool((Optional *)local_40);
  if (bVar2) {
    local_c8 = string._24_8_;
    sStack_c0 = in_RDX;
    string_00 = Containers::Optional<Corrade::Containers::String>::operator*
                          ((Optional<Corrade::Containers::String> *)local_40);
    Containers::BasicStringView<const_char>::BasicStringView(&local_d8,string_00);
    filename_01._sizePlusFlags = local_c8;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_R9;
    tokenize(filename_01,sStack_c0,0,(StringView)(auVar1 << 0x40));
  }
  else {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_91);
    Error::Error(&local_90,local_91);
    this = Debug::operator<<(&local_90.super_Debug,"Utility::Json::fromFile(): can\'t read");
    local_a8 = string._set;
    uStack_a7 = string._25_7_;
    value._sizePlusFlags = in_RDX;
    value._data = (char *)string._24_8_;
    Debug::operator<<(this,value);
    Error::~Error(&local_90);
    Containers::Optional<Corrade::Utility::Json>::Optional
              ((Optional<Corrade::Utility::Json> *)filename_01._data);
  }
  local_b0 = 1;
  Containers::Optional<Corrade::Containers::String>::~Optional
            ((Optional<Corrade::Containers::String> *)local_40);
  OVar3._8_8_ = extraout_RDX;
  OVar3.field_0 = filename_01._data;
  return OVar3;
}

Assistant:

Containers::Optional<Json> Json::fromFile(const Containers::StringView filename) {
    Containers::Optional<Containers::String> string = Path::readString(filename);
    if(!string) {
        Error{} << "Utility::Json::fromFile(): can't read" << filename;
        return {};
    }

    return tokenize(filename, 0, 0, *string);
}